

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyTable.cpp
# Opt level: O2

WebAssemblyTable *
Js::WebAssemblyTable::Create(uint32 initial,uint32 maximum,ScriptContext *scriptContext)

{
  Recycler *pRVar1;
  WriteBarrierPtr<void> *values;
  WebAssemblyTable *this;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if ((initial <= maximum) && ((DAT_01430302 != '\0' || (maximum <= DAT_01430308)))) {
    if (initial == 0) {
      values = (Type *)0x0;
    }
    else {
      local_58 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_95534bf;
      data.filename._0_4_ = 0xd1;
      data.plusSize = (ulong)initial;
      pRVar1 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
      values = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                         ((Memory *)pRVar1,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)initial)
      ;
    }
    local_58 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_95534bf;
    data.filename._0_4_ = 0xd3;
    pRVar1 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
    this = (WebAssemblyTable *)new<Memory::Recycler>(0x38,pRVar1,0x37a1d4);
    WebAssemblyTable(this,values,initial,initial,maximum,
                     (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                     webAssemblyTableType).ptr);
    return this;
  }
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ebf6,(PCWSTR)0x0);
}

Assistant:

WebAssemblyTable *
WebAssemblyTable::Create(uint32 initial, uint32 maximum, ScriptContext * scriptContext)
{
    if (initial > maximum || initial > Wasm::Limits::GetMaxTableSize() || maximum > Wasm::Limits::GetMaxTableSize())
    {
        JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange);
    }
    Field(Var) * values = nullptr;
    if (initial > 0)
    {
        values = RecyclerNewArrayZ(scriptContext->GetRecycler(), Field(Var), initial);
    }
    return RecyclerNew(scriptContext->GetRecycler(), WebAssemblyTable, values, initial, initial, maximum, scriptContext->GetLibrary()->GetWebAssemblyTableType());
}